

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt.cpp
# Opt level: O1

long testCreateHeartbeat(int count)

{
  __time_t _Var1;
  __suseconds_t _Var2;
  timeval tv;
  timeval local_188;
  Message local_178 [344];
  
  gettimeofday(&local_188,(__timezone_ptr_t)0x0);
  _Var2 = local_188.tv_usec;
  _Var1 = local_188.tv_sec;
  if (0 < count) {
    do {
      FIX42::Heartbeat::Heartbeat((Heartbeat *)local_178);
      FIX::Message::~Message(local_178);
      count = count + -1;
    } while (count != 0);
  }
  gettimeofday(&local_188,(__timezone_ptr_t)0x0);
  return (local_188.tv_usec - (_Var2 + (long)((double)_Var1 * 1000000.0))) +
         (long)((double)local_188.tv_sec * 1000000.0);
}

Assistant:

long testCreateHeartbeat(int count) {
  count = count - 1;

  long start = GetTickCount();
  for (int i = 0; i <= count; ++i) {
    FIX42::Heartbeat();
  }

  return GetTickCount() - start;
}